

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall
apngasm::APNGAsm::process_rect
          (APNGAsm *this,uchar *row,int rowbytes,int bpp,int stride,int h,uchar *rows)

{
  uchar *puVar1;
  uint uVar2;
  uInt uVar3;
  long lVar4;
  uchar *__src;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uchar *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uchar *local_80;
  
  uVar3 = rowbytes + 1;
  iVar12 = 0;
  uVar17 = 0;
  if (0 < rowbytes) {
    uVar17 = (ulong)(uint)rowbytes;
  }
  uVar19 = 0;
  if (0 < bpp) {
    uVar19 = (ulong)(uint)bpp;
  }
  lVar4 = (long)bpp;
  if (h < 1) {
    h = iVar12;
  }
  lVar18 = (long)rowbytes;
  local_80 = rows;
  puVar11 = (uchar *)0x0;
  do {
    if (iVar12 == h) {
      return;
    }
    __src = this->_row_buf;
    uVar5 = 0;
    for (uVar9 = 0; uVar17 != uVar9; uVar9 = uVar9 + 1) {
      bVar15 = row[uVar9];
      __src[uVar9 + 1] = bVar15;
      uVar7 = 0x100 - bVar15;
      if (-1 < (char)bVar15) {
        uVar7 = (uint)bVar15;
      }
      uVar5 = uVar5 + uVar7;
    }
    puVar1 = this->_sub_row;
    uVar7 = 0;
    for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
      bVar15 = row[uVar9];
      puVar1[uVar9 + 1] = bVar15;
      uVar8 = 0x100 - bVar15;
      if (-1 < (char)bVar15) {
        uVar8 = (uint)bVar15;
      }
      uVar7 = uVar7 + uVar8;
    }
    lVar13 = 0;
    lVar14 = lVar4;
    do {
      if (lVar18 <= lVar14) break;
      bVar15 = row[lVar14] - row[lVar13];
      puVar1[lVar14 + 1] = bVar15;
      uVar8 = 0x100 - bVar15;
      if (-1 < (char)bVar15) {
        uVar8 = (uint)bVar15;
      }
      uVar7 = uVar7 + uVar8;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 1;
    } while (uVar7 <= uVar5);
    if (uVar7 < uVar5) {
      __src = this->_sub_row;
      uVar5 = uVar7;
    }
    if (puVar11 != (uchar *)0x0) {
      puVar1 = this->_up_row;
      uVar9 = 0;
      uVar7 = 0;
      do {
        if (uVar17 == uVar9) break;
        bVar15 = row[uVar9] - puVar11[uVar9];
        uVar8 = 0x100 - bVar15;
        if (-1 < (char)bVar15) {
          uVar8 = (uint)bVar15;
        }
        puVar1[uVar9 + 1] = bVar15;
        uVar7 = uVar7 + uVar8;
        uVar9 = uVar9 + 1;
      } while (uVar7 <= uVar5);
      if (uVar7 < uVar5) {
        __src = this->_up_row;
      }
      puVar1 = this->_avg_row;
      uVar8 = 0;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        bVar15 = row[uVar9] - (puVar11[uVar9] >> 1);
        puVar1[uVar9 + 1] = bVar15;
        uVar10 = 0x100 - bVar15;
        if (-1 < (char)bVar15) {
          uVar10 = (uint)bVar15;
        }
        uVar8 = uVar8 + uVar10;
      }
      if (uVar7 < uVar5) {
        uVar5 = uVar7;
      }
      lVar13 = 0;
      lVar14 = lVar4;
      do {
        if (lVar18 <= lVar14) break;
        bVar15 = row[lVar14] - (char)((uint)row[lVar13] + (uint)puVar11[lVar14] >> 1);
        puVar1[lVar14 + 1] = bVar15;
        uVar7 = 0x100 - bVar15;
        if (-1 < (char)bVar15) {
          uVar7 = (uint)bVar15;
        }
        uVar8 = uVar8 + uVar7;
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 1;
      } while (uVar8 <= uVar5);
      if (uVar8 < uVar5) {
        __src = this->_avg_row;
      }
      puVar1 = this->_paeth_row;
      uVar7 = 0;
      for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        bVar15 = row[uVar9] - puVar11[uVar9];
        puVar1[uVar9 + 1] = bVar15;
        uVar10 = 0x100 - bVar15;
        if (-1 < (char)bVar15) {
          uVar10 = (uint)bVar15;
        }
        uVar7 = uVar7 + uVar10;
      }
      if (uVar8 < uVar5) {
        uVar5 = uVar8;
      }
      lVar14 = 0;
      do {
        if (lVar18 <= lVar4 + lVar14) break;
        bVar15 = puVar11[lVar14];
        uVar10 = (uint)puVar11[lVar14 + lVar4] - (uint)bVar15;
        uVar16 = (uint)row[lVar14] - (uint)bVar15;
        uVar8 = -uVar10;
        if (0 < (int)uVar10) {
          uVar8 = uVar10;
        }
        uVar2 = -uVar16;
        if (0 < (int)uVar16) {
          uVar2 = uVar16;
        }
        uVar16 = uVar16 + uVar10;
        uVar10 = -uVar16;
        if (0 < (int)uVar16) {
          uVar10 = uVar16;
        }
        if ((uVar2 & 0xff) <= uVar10) {
          bVar15 = puVar11[lVar14 + lVar4];
        }
        bVar6 = row[lVar14];
        if (uVar10 < (uVar8 & 0xff)) {
          bVar6 = bVar15;
        }
        if ((uVar2 & 0xff) < (uVar8 & 0xff)) {
          bVar6 = bVar15;
        }
        bVar6 = row[lVar14 + lVar4] - bVar6;
        uVar8 = 0x100 - bVar6;
        if (-1 < (char)bVar6) {
          uVar8 = (uint)bVar6;
        }
        puVar1[lVar14 + lVar4 + 1] = bVar6;
        uVar7 = uVar7 + uVar8;
        lVar14 = lVar14 + 1;
      } while (uVar7 <= uVar5);
      if (uVar7 < uVar5) {
        __src = this->_paeth_row;
      }
    }
    if (rows == (uchar *)0x0) {
      (this->_op_zstream1).next_in = this->_row_buf;
      (this->_op_zstream1).avail_in = uVar3;
      deflate(&this->_op_zstream1,0);
      (this->_op_zstream2).next_in = __src;
      (this->_op_zstream2).avail_in = uVar3;
      deflate(&this->_op_zstream2,0);
    }
    else {
      memcpy(local_80,__src,(long)(int)uVar3);
      local_80 = local_80 + (int)uVar3;
    }
    iVar12 = iVar12 + 1;
    puVar11 = row;
    row = row + stride;
  } while( true );
}

Assistant:

void APNGAsm::process_rect(unsigned char * row, int rowbytes, int bpp, int stride, int h, unsigned char * rows)
  {
    int i, j, v;
    int a, b, c, pa, pb, pc, p;
    unsigned char * prev = NULL;
    unsigned char * dp  = rows;
    unsigned char * out;

    for (j=0; j<h; j++)
    {
      unsigned int    sum = 0;
      unsigned char * best_row = _row_buf;
      unsigned int    mins = ((unsigned int)(-1)) >> 1;

      out = _row_buf+1;
      for (i=0; i<rowbytes; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      mins = sum;

      sum = 0;
      out = _sub_row+1;
      for (i=0; i<bpp; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      for (i=bpp; i<rowbytes; i++)
      {
        v = out[i] = row[i] - row[i-bpp];
        sum += (v < 128) ? v : 256 - v;
        if (sum > mins) break;
      }
      if (sum < mins)
      {
        mins = sum;
        best_row = _sub_row;
      }

      if (prev)
      {
        sum = 0;
        out = _up_row+1;
        for (i=0; i<rowbytes; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _up_row;
        }

        sum = 0;
        out = _avg_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i]/2;
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          v = out[i] = row[i] - (prev[i] + row[i-bpp])/2;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _avg_row;
        }

        sum = 0;
        out = _paeth_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          a = row[i-bpp];
          b = prev[i];
          c = prev[i-bpp];
          p = b - c;
          pc = a - c;
          pa = abs(p);
          pb = abs(pc);
          pc = abs(p + pc);
          p = (pa <= pb && pa <=pc) ? a : (pb <= pc) ? b : c;
          v = out[i] = row[i] - p;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          best_row = _paeth_row;
        }
      }

      if (rows == NULL)
      {
        // deflate_rect_op()
        _op_zstream1.next_in = _row_buf;
        _op_zstream1.avail_in = rowbytes + 1;
        deflate(&_op_zstream1, Z_NO_FLUSH);

        _op_zstream2.next_in = best_row;
        _op_zstream2.avail_in = rowbytes + 1;
        deflate(&_op_zstream2, Z_NO_FLUSH);
      }
      else
      {
        // deflate_rect_fin()
        memcpy(dp, best_row, rowbytes+1);
        dp += rowbytes+1;
      }

      prev = row;
      row += stride;
    }
  }